

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_reader.h
# Opt level: O0

void __thiscall draco::PlyElement::AddProperty(PlyElement *this,PlyProperty *prop)

{
  bool bVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  reference this_00;
  mapped_type mVar4;
  PlyProperty *in_RSI;
  PlyProperty *in_RDI;
  int num_entries;
  undefined4 in_stack_ffffffffffffffe0;
  
  sVar2 = std::vector<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>::size
                    ((vector<draco::PlyProperty,_std::allocator<draco::PlyProperty>_> *)
                     &(in_RDI->data_).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  mVar4 = (mapped_type)sVar2;
  num_entries = (int)((ulong)&(in_RDI->list_data_).super__Vector_base<long,_std::allocator<long>_>.
                              _M_impl.super__Vector_impl_data._M_finish >> 0x20);
  PlyProperty::name_abi_cxx11_(in_RSI);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         *)this,&prop->name_);
  *pmVar3 = mVar4;
  std::vector<draco::PlyProperty,std::allocator<draco::PlyProperty>>::
  emplace_back<draco::PlyProperty_const&>
            ((vector<draco::PlyProperty,_std::allocator<draco::PlyProperty>_> *)in_RSI,in_RDI);
  this_00 = std::vector<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>::back
                      ((vector<draco::PlyProperty,_std::allocator<draco::PlyProperty>_> *)
                       CONCAT44(mVar4,in_stack_ffffffffffffffe0));
  bVar1 = PlyProperty::is_list(this_00);
  if (!bVar1) {
    std::vector<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>::back
              ((vector<draco::PlyProperty,_std::allocator<draco::PlyProperty>_> *)
               CONCAT44(mVar4,in_stack_ffffffffffffffe0));
    PlyProperty::ReserveData((PlyProperty *)CONCAT44(mVar4,in_stack_ffffffffffffffe0),num_entries);
  }
  return;
}

Assistant:

void AddProperty(const PlyProperty &prop) {
    property_index_[prop.name()] = static_cast<int>(properties_.size());
    properties_.emplace_back(prop);
    if (!properties_.back().is_list()) {
      properties_.back().ReserveData(static_cast<int>(num_entries_));
    }
  }